

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gepard-trapezoid-tessellator.cpp
# Opt level: O0

TrapezoidList * __thiscall
gepard::TrapezoidTessellator::trapezoidList_abi_cxx11_
          (TrapezoidList *__return_storage_ptr__,TrapezoidTessellator *this,GepardState *state)

{
  Float *pFVar1;
  double dVar2;
  Float FVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  FillRule FVar7;
  int iVar8;
  pointer pTVar9;
  reference pTVar10;
  FloatPoint FVar11;
  _Self local_378;
  _Self local_370;
  iterator further;
  _Self local_360;
  iterator ft;
  Float bottomY;
  _Self local_348;
  iterator current;
  BoundingBox local_338;
  BoundingBox local_318;
  BoundingBox local_2f8;
  BoundingBox local_2d8;
  Segment *local_2b8;
  Segment *segment;
  iterator __end2;
  iterator __begin2;
  SegmentList *__range2;
  undefined1 auStack_290 [3];
  bool isInFill;
  int fill;
  Trapezoid trapezoid;
  Float denom;
  TrapezoidList trapezoids;
  SegmentList *segmentList;
  Float local_218;
  FloatPoint local_210;
  FloatPoint local_200;
  ArcElement *local_1f0;
  ArcElement *ae;
  Float local_1e0;
  FloatPoint local_1d8;
  FloatPoint local_1c8;
  FloatPoint local_1b8;
  ArcElement *local_1a8;
  BezierCurveToElement *be;
  Float local_198;
  FloatPoint local_190;
  FloatPoint local_180;
  ArcElement *local_170;
  QuadraticCurveToElement *qe;
  Float local_160;
  FloatPoint local_158;
  FloatPoint local_148;
  FloatPoint local_138;
  FloatPoint local_128;
  FloatPoint local_118;
  undefined1 local_108 [8];
  Transform at;
  FloatPoint lastMoveTo;
  FloatPoint to;
  undefined1 auStack_a8 [8];
  FloatPoint from;
  undefined1 local_90 [8];
  SegmentApproximator segmentApproximator;
  Float subPixelPrecision;
  PathElement *element;
  GepardState *state_local;
  TrapezoidTessellator *this_local;
  TrapezoidList *trapezoidList;
  
  subPixelPrecision = (Float)PathData::firstElement(this->_pathData);
  if (((PathElement *)subPixelPrecision == (PathElement *)0x0) ||
     (((PathElement *)subPixelPrecision)->next == (PathElement *)0x0)) {
    memset(__return_storage_ptr__,0,0x18);
    std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::list
              (__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (((PathElement *)subPixelPrecision)->type != MoveTo) {
    __assert_fail("element->type == PathElementTypes::MoveTo",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                  ,0x283,
                  "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                 );
  }
  segmentApproximator._boundingBox.maxY = 1.0;
  SegmentApproximator::SegmentApproximator
            ((SegmentApproximator *)local_90,this->_antiAliasingLevel,1.0);
  FloatPoint::FloatPoint((FloatPoint *)auStack_a8);
  at.data[5] = (((PathElement *)subPixelPrecision)->to).x;
  to.x = (((PathElement *)subPixelPrecision)->to).y;
  lastMoveTo.x = to.x;
  lastMoveTo.y = at.data[5];
  memcpy(local_108,&state->transform,0x30);
  do {
    auStack_a8 = (undefined1  [8])lastMoveTo.y;
    from.x = to.x;
    subPixelPrecision = *(Float *)((long)subPixelPrecision + 8);
    lastMoveTo.y = (((ArcElement *)subPixelPrecision)->super_PathElement).to.x;
    to.x = (((ArcElement *)subPixelPrecision)->super_PathElement).to.y;
    switch((((ArcElement *)subPixelPrecision)->super_PathElement).type) {
    case Undefined:
      break;
    case MoveTo:
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)auStack_a8);
      local_118.y = FVar11.y;
      local_118.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)(at.data + 5));
      local_128.y = FVar11.y;
      local_128.x = FVar11.x;
      SegmentApproximator::insertLine((SegmentApproximator *)local_90,&local_118,&local_128);
      at.data[5] = lastMoveTo.y;
      lastMoveTo.x = to.x;
      break;
    case LineTo:
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)auStack_a8);
      local_138.y = FVar11.y;
      local_138.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)&lastMoveTo.y);
      local_148.y = FVar11.y;
      local_148.x = FVar11.x;
      SegmentApproximator::insertLine((SegmentApproximator *)local_90,&local_138,&local_148);
      break;
    case QuadraticCurve:
      local_170 = (ArcElement *)subPixelPrecision;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)auStack_a8);
      local_180.y = FVar11.y;
      local_180.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,&local_170->center);
      local_190.y = FVar11.y;
      local_190.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)&lastMoveTo.y);
      local_198 = FVar11.y;
      be = (BezierCurveToElement *)FVar11.x;
      SegmentApproximator::insertQuadCurve
                ((SegmentApproximator *)local_90,&local_180,&local_190,(FloatPoint *)&be);
      break;
    case BezierCurve:
      local_1a8 = (ArcElement *)subPixelPrecision;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)auStack_a8);
      local_1b8.y = FVar11.y;
      local_1b8.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,&local_1a8->center);
      local_1c8.y = FVar11.y;
      local_1c8.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,&local_1a8->radius);
      local_1d8.y = FVar11.y;
      local_1d8.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)&lastMoveTo.y);
      local_1e0 = FVar11.y;
      ae = (ArcElement *)FVar11.x;
      SegmentApproximator::insertBezierCurve
                ((SegmentApproximator *)local_90,&local_1b8,&local_1c8,&local_1d8,(FloatPoint *)&ae)
      ;
      break;
    case Arc:
      local_1f0 = (ArcElement *)subPixelPrecision;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)auStack_a8);
      local_200.y = FVar11.y;
      local_200.x = FVar11.x;
      SegmentApproximator::insertArc
                ((SegmentApproximator *)local_90,&local_200,local_1f0,(Transform *)local_108);
      break;
    case CloseSubpath:
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)auStack_a8);
      local_158.y = FVar11.y;
      local_158.x = FVar11.x;
      FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)(at.data + 5));
      local_160 = FVar11.y;
      qe = (QuadraticCurveToElement *)FVar11.x;
      SegmentApproximator::insertLine((SegmentApproximator *)local_90,&local_158,(FloatPoint *)&qe);
      at.data[5] = lastMoveTo.y;
      lastMoveTo.x = to.x;
    }
  } while ((((ArcElement *)subPixelPrecision)->super_PathElement).next != (PathElement *)0x0);
  FVar11 = Transform::apply((Transform *)local_108,
                            &(((ArcElement *)subPixelPrecision)->super_PathElement).to);
  local_210.y = FVar11.y;
  local_210.x = FVar11.x;
  FVar11 = Transform::apply((Transform *)local_108,(FloatPoint *)(at.data + 5));
  local_218 = FVar11.y;
  segmentList = (SegmentList *)FVar11.x;
  SegmentApproximator::insertLine
            ((SegmentApproximator *)local_90,&local_210,(FloatPoint *)&segmentList);
  trapezoids.super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>._M_impl._M_node
  ._M_size = (size_t)SegmentApproximator::segments_abi_cxx11_((SegmentApproximator *)local_90);
  std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::list
            ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom);
  sVar4 = trapezoids.super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>._M_impl
          ._M_node._M_size;
  trapezoid.rightSlope = (Float)this->_antiAliasingLevel;
  if (trapezoids.super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>._M_impl.
      _M_node._M_size != 0) {
    __range2._4_4_ = 0;
    bVar6 = false;
    __end2 = std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::begin
                       ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)
                        trapezoids.
                        super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>.
                        _M_impl._M_node._M_size);
    segment = (Segment *)
              std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::end
                        ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)sVar4);
    while (bVar5 = std::operator!=(&__end2,(_Self *)&segment),
          sVar4 = trapezoids.super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>
                  ._M_impl._M_node._M_size, bVar5) {
      local_2b8 = std::_List_iterator<gepard::Segment>::operator*(&__end2);
      dVar2 = (local_2b8->from).y;
      pFVar1 = &(local_2b8->to).y;
      if ((dVar2 != *pFVar1) || (NAN(dVar2) || NAN(*pFVar1))) {
        FVar7 = fillRule(this);
        if (FVar7 == EvenOdd) {
          __range2._4_4_ = (uint)((__range2._4_4_ != 0 ^ 0xffU) & 1);
        }
        else {
          __range2._4_4_ = local_2b8->direction + __range2._4_4_;
        }
        if (__range2._4_4_ == 0) {
          FVar3 = fixPrecision((local_2b8->from).x);
          trapezoid.topLeftX = FVar3 / trapezoid.rightSlope;
          FVar3 = fixPrecision((local_2b8->to).x);
          trapezoid.bottomLeftX = FVar3 / trapezoid.rightSlope;
          trapezoid.bottomRightX._4_4_ = (undefined4)(long)local_2b8->id;
          trapezoid.leftSlope = local_2b8->realSlope;
          if ((_auStack_290 != trapezoid.topRightX) ||
             (NAN(_auStack_290) || NAN(trapezoid.topRightX))) {
            std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::push_back
                      ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom,
                       (value_type *)auStack_290);
          }
          bVar6 = false;
        }
        else if (!bVar6) {
          iVar8 = Segment::topY(local_2b8);
          _auStack_290 = fixPrecision((double)iVar8 / trapezoid.rightSlope);
          iVar8 = Segment::bottomY(local_2b8);
          trapezoid.topRightX = fixPrecision((double)iVar8 / trapezoid.rightSlope);
          FVar3 = fixPrecision((local_2b8->from).x);
          trapezoid.topY = FVar3 / trapezoid.rightSlope;
          FVar3 = fixPrecision((local_2b8->to).x);
          trapezoid.bottomY = FVar3 / trapezoid.rightSlope;
          trapezoid.bottomRightX._0_4_ = (undefined4)(long)local_2b8->id;
          trapezoid._48_8_ = local_2b8->realSlope;
          if ((_auStack_290 != trapezoid.topRightX) ||
             (NAN(_auStack_290) || NAN(trapezoid.topRightX))) {
            bVar6 = true;
          }
        }
      }
      std::_List_iterator<gepard::Segment>::operator++(&__end2);
    }
    if (trapezoids.super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>._M_impl.
        _M_node._M_size != 0) {
      std::__cxx11::list<gepard::Segment,_std::allocator<gepard::Segment>_>::~list
                ((list<gepard::Segment,_std::allocator<gepard::Segment>_> *)
                 trapezoids.super__List_base<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>.
                 _M_impl._M_node._M_size);
      operator_delete((void *)sVar4);
    }
    SegmentApproximator::boundingBox(&local_2d8,(SegmentApproximator *)local_90);
    FVar3 = fixPrecision(local_2d8.minX);
    (this->_boundingBox).minX = FVar3 / (double)this->_antiAliasingLevel;
    SegmentApproximator::boundingBox(&local_2f8,(SegmentApproximator *)local_90);
    FVar3 = fixPrecision(local_2f8.minY);
    (this->_boundingBox).minY = FVar3 / (double)this->_antiAliasingLevel;
    SegmentApproximator::boundingBox(&local_318,(SegmentApproximator *)local_90);
    FVar3 = fixPrecision(local_318.maxX);
    (this->_boundingBox).maxX = FVar3 / (double)this->_antiAliasingLevel;
    SegmentApproximator::boundingBox(&local_338,(SegmentApproximator *)local_90);
    FVar3 = fixPrecision(local_338.maxY);
    (this->_boundingBox).maxY = FVar3 / (double)this->_antiAliasingLevel;
  }
  std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::sort
            ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom);
  current._M_node._7_1_ = 0;
  std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::list
            (__return_storage_ptr__);
  local_348._M_node =
       (_List_node_base *)
       std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::begin
                 ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom);
LAB_0012ce05:
  bottomY = (Float)std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::end
                             ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom)
  ;
  bVar6 = std::operator!=(&local_348,(_Self *)&bottomY);
  if (!bVar6) {
    current._M_node._7_1_ = 1;
    std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::~list
              ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom);
    SegmentApproximator::~SegmentApproximator((SegmentApproximator *)local_90);
    return __return_storage_ptr__;
  }
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  ft._M_node = (_List_node_base *)pTVar9->bottomY;
  local_360._M_node = local_348._M_node;
  while( true ) {
    further = std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::end
                        ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom);
    bVar5 = std::operator!=(&local_360,&further);
    bVar6 = false;
    if (bVar5) {
      pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_360);
      bVar6 = pTVar9->bottomY == (double)ft._M_node;
    }
    if (!bVar6) break;
    std::_List_iterator<gepard::Trapezoid>::operator++(&local_360);
  }
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  bVar6 = false;
  if (pTVar9->leftId != 0) {
    pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
    bVar6 = pTVar9->rightId != 0;
  }
  if (!bVar6) {
    __assert_fail("current->leftId != 0 && current->rightId != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                  ,0x2fa,
                  "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                 );
  }
  std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  local_370._M_node = local_348._M_node;
  do {
    local_378._M_node =
         (_List_node_base *)
         std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::end
                   ((list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_> *)&denom);
    bVar5 = std::operator!=(&local_370,&local_378);
    bVar6 = false;
    if (bVar5) {
      pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
      bVar6 = pTVar9->topY <= (double)ft._M_node;
    }
    if (!bVar6) goto LAB_0012d25d;
    pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
    bVar6 = false;
    if (pTVar9->leftId != 0) {
      pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
      bVar6 = pTVar9->rightId != 0;
    }
    if (!bVar6) {
      __assert_fail("further->leftId != 0 && further->rightId != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/szledan[P]gepard/src/engines/gepard-trapezoid-tessellator.cpp"
                    ,0x2fd,
                    "const TrapezoidList gepard::TrapezoidTessellator::trapezoidList(const GepardState &)"
                   );
    }
    std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
    std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
    pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
    dVar2 = pTVar9->topY;
    pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
    if ((dVar2 == pTVar9->bottomY) && (!NAN(dVar2) && !NAN(pTVar9->bottomY))) {
      pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
      pTVar10 = std::_List_iterator<gepard::Trapezoid>::operator*(&local_370);
      bVar6 = Trapezoid::isMergableInTo(pTVar9,pTVar10);
      if (bVar6) break;
    }
    std::_List_iterator<gepard::Trapezoid>::operator++(&local_370);
  } while( true );
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  FVar3 = pTVar9->topY;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
  pTVar9->topY = FVar3;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  FVar3 = pTVar9->topLeftX;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
  pTVar9->topLeftX = FVar3;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  FVar3 = pTVar9->topRightX;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_370);
  pTVar9->topRightX = FVar3;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  pTVar9->leftId = 0;
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  pTVar9->rightId = 0;
LAB_0012d25d:
  pTVar9 = std::_List_iterator<gepard::Trapezoid>::operator->(&local_348);
  if (pTVar9->leftId != 0) {
    pTVar10 = std::_List_iterator<gepard::Trapezoid>::operator*(&local_348);
    std::__cxx11::list<gepard::Trapezoid,_std::allocator<gepard::Trapezoid>_>::push_back
              (__return_storage_ptr__,pTVar10);
  }
  std::_List_iterator<gepard::Trapezoid>::operator++(&local_348);
  goto LAB_0012ce05;
}

Assistant:

const TrapezoidList TrapezoidTessellator::trapezoidList(const GepardState& state)
{
    PathElement* element = _pathData.firstElement();

    if (!element || !element->next)
        return TrapezoidList();

    GD_ASSERT(element->type == PathElementTypes::MoveTo);

    const Float subPixelPrecision = 1.0;
    SegmentApproximator segmentApproximator(_antiAliasingLevel, subPixelPrecision);
    FloatPoint from;
    FloatPoint to = element->to;
    FloatPoint lastMoveTo = to;
    Transform at = state.transform;

    // 1. Insert path elements.
    do {
        from = to;
        element = element->next;
        to = element->to;
        switch (element->type) {
        case PathElementTypes::MoveTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::LineTo: {
            segmentApproximator.insertLine(at.apply(from), at.apply(to));
            break;
        }
        case PathElementTypes::CloseSubpath: {
            segmentApproximator.insertLine(at.apply(from), at.apply(lastMoveTo));
            lastMoveTo = to;
            break;
        }
        case PathElementTypes::QuadraticCurve: {
            QuadraticCurveToElement* qe = reinterpret_cast<QuadraticCurveToElement*>(element);
            segmentApproximator.insertQuadCurve(at.apply(from), at.apply(qe->control), at.apply(to));
            break;
        }
        case PathElementTypes::BezierCurve: {
            BezierCurveToElement* be = reinterpret_cast<BezierCurveToElement*>(element);
            segmentApproximator.insertBezierCurve(at.apply(from), at.apply(be->control1), at.apply(be->control2), at.apply(to));
            break;
        }
        case PathElementTypes::Arc: {
            ArcElement* ae = reinterpret_cast<ArcElement*>(element);
            segmentApproximator.insertArc(at.apply(from), ae, at);
            break;
        }
        case PathElementTypes::Undefined:
        default:
            // unreachable
            break;
        }
    } while (element->next != nullptr);

    segmentApproximator.insertLine(at.apply(element->to), at.apply(lastMoveTo));

    // 2. Use approximator to generate the list of segments.
    SegmentList* segmentList = segmentApproximator.segments();
    TrapezoidList trapezoids;

    // 3. Generate trapezoids.
    const Float denom = _antiAliasingLevel * 1 + 0;
    if (segmentList) {
        Trapezoid trapezoid;
        int fill = 0;
        bool isInFill = false;
        for (Segment& segment : *segmentList) {
            if (segment.from.y == segment.to.y)
                continue;
            if (fillRule() == EvenOdd) {
                fill = !fill;
            } else {
                fill += segment.direction;
            }

            if (fill) {
                if (!isInFill) {
                    trapezoid.topY = (fixPrecision(segment.topY() / denom));
                    trapezoid.bottomY = (fixPrecision(segment.bottomY() / denom));
                    trapezoid.topLeftX = (fixPrecision(segment.from.x) / denom);
                    trapezoid.bottomLeftX = (fixPrecision(segment.to.x) / denom);
                    trapezoid.leftId = segment.id;
                    trapezoid.leftSlope = segment.realSlope;
                    if (trapezoid.topY != trapezoid.bottomY)
                        isInFill = true;
                }
            } else {
                // TODO: Horizontal merge trapezoids.
                trapezoid.topRightX = (fixPrecision(segment.from.x) / denom);
                trapezoid.bottomRightX = (fixPrecision(segment.to.x) / denom);
                trapezoid.rightId = segment.id;
                trapezoid.rightSlope = segment.realSlope;
                if (trapezoid.topY != trapezoid.bottomY) {
                    trapezoids.push_back(trapezoid);
                }
                isInFill = false;
            }
            //! \todo(szledan): we need this assert in the future,
            //! but the TT doesn't work correctly now with that.
            // GD_ASSERT(trapezoid.topY == (fixPrecision(segment.topY() / denom)));
        }

        delete segmentList;

        //! \todo(szledan): check the boundingBox calculation:
        // NOTE:  maxX = (maxX + (_antiAliasingLevel - 1)) / _antiAliasingLevel;
        _boundingBox.minX = (fixPrecision(segmentApproximator.boundingBox().minX) / _antiAliasingLevel);
        _boundingBox.minY = (fixPrecision(segmentApproximator.boundingBox().minY) / _antiAliasingLevel);
        _boundingBox.maxX = (fixPrecision(segmentApproximator.boundingBox().maxX) / _antiAliasingLevel);
        _boundingBox.maxY = (fixPrecision(segmentApproximator.boundingBox().maxY) / _antiAliasingLevel);
    }

    trapezoids.sort();

    // 4. Vertical merge trapezoids.
    //! \todo(szledan): use MovePtr:
    TrapezoidList trapezoidList;
    for (TrapezoidList::iterator current = trapezoids.begin(); current != trapezoids.end(); ++current) {
        const Float bottomY = current->bottomY;
        TrapezoidList::iterator ft = current;
        for (; (ft != trapezoids.end() && ft->bottomY == bottomY); ++ft);

        GD_ASSERT(current->leftId != 0 && current->rightId != 0);
        GD_ASSERT(current->leftSlope != NAN && current->rightSlope != NAN);
        for (TrapezoidList::iterator further = current; (further != trapezoids.end() && further->topY <= bottomY); ++further) {
            GD_ASSERT(further->leftId != 0 && further->rightId != 0);
            GD_ASSERT(further->leftSlope != NAN && further->rightSlope != NAN);
            if (further->topY == current->bottomY && current->isMergableInTo(&*further)) {
                further->topY = current->topY;
                further->topLeftX = current->topLeftX;
                further->topRightX = current->topRightX;
                current->leftId = 0;
                current->rightId = 0;
                break;
            }
        }
        if (current->leftId) {
            trapezoidList.push_back(*current);
        }
    }

    return trapezoidList;
}